

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O0

void __thiscall std::pmr::test_resource::print(test_resource *this)

{
  bool bVar1;
  size_type sVar2;
  const_pointer pvVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> guard;
  test_resource *this_local;
  
  guard._M_device = (mutex_type *)this;
  lock_guard<std::mutex>::lock_guard(&local_20,&this->m_lock_);
  bVar1 = basic_string_view<char,_std::char_traits<char>_>::empty(&this->m_name_);
  if (bVar1) {
    printf(
          "\n==================================================\n                TEST RESOURCE STATE\n--------------------------------------------------\n"
          );
  }
  else {
    sVar2 = basic_string_view<char,_std::char_traits<char>_>::length(&this->m_name_);
    pvVar3 = basic_string_view<char,_std::char_traits<char>_>::data(&this->m_name_);
    printf("\n==================================================\n                TEST RESOURCE %.*s STATE\n--------------------------------------------------\n"
           ,sVar2 & 0xffffffff,pvVar3);
  }
  lVar4 = blocks_in_use(this);
  lVar5 = bytes_in_use(this);
  lVar6 = max_blocks(this);
  lVar7 = max_bytes(this);
  lVar8 = total_blocks(this);
  lVar9 = total_bytes(this);
  lVar10 = mismatches(this);
  lVar11 = bounds_errors(this);
  lVar12 = bad_deallocate_params(this);
  printf("        Category\tBlocks\tBytes\n        --------\t------\t-----\n          IN USE\t%lld\t%lld\n             MAX\t%lld\t%lld\n           TOTAL\t%lld\t%lld\n      MISMATCHES\t%lld\n   BOUNDS ERRORS\t%lld\n   PARAM. ERRORS\t%lld\n--------------------------------------------------\n"
         ,lVar4,lVar5,lVar6,lVar7,lVar8,lVar9,lVar10,lVar11,lVar12);
  if (this->m_list_->d_head_p != (Link *)0x0) {
    printf(" Indices of Outstanding Memory Allocations:\n ");
    printList(this->m_list_);
  }
  fflush(_stdout);
  lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void test_resource::print() const noexcept
{
    lock_guard guard{ m_lock_ };

    if (!m_name_.empty()) {
        printf("\n"
               "==================================================\n"
               "                TEST RESOURCE %.*s STATE\n"
               "--------------------------------------------------\n",
               static_cast<int>(m_name_.length()), m_name_.data());
    }
    else {
        printf("\n"
               "==================================================\n"
               "                TEST RESOURCE STATE\n"
               "--------------------------------------------------\n");
    }

    printf("        Category\tBlocks\tBytes\n"
           "        --------\t------\t-----\n"
           "          IN USE\t%lld\t%lld\n"
           "             MAX\t%lld\t%lld\n"
           "           TOTAL\t%lld\t%lld\n"
           "      MISMATCHES\t%lld\n"
           "   BOUNDS ERRORS\t%lld\n"
           "   PARAM. ERRORS\t%lld\n"
           "--------------------------------------------------\n",
           blocks_in_use(), bytes_in_use(),
           max_blocks(),    max_bytes(),
           total_blocks(),  total_bytes(),
           mismatches(),    bounds_errors(),
           bad_deallocate_params());

    if (m_list_->d_head_p) {
        printf(" Indices of Outstanding Memory Allocations:\n ");
        printList(*m_list_);
    }
    std::fflush(stdout);
}